

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O3

err_t stb99SeedVal(stb99_seed *seed)

{
  size_t r;
  bool_t bVar1;
  err_t eVar2;
  long lVar3;
  
  bVar1 = memIsValid(seed,0x128);
  if (bVar1 == 0) {
    return 0x6d;
  }
  lVar3 = 0;
  while (*(size_t *)((long)_ls + lVar3) != seed->l) {
    lVar3 = lVar3 + 8;
    if (lVar3 == 0x50) {
      return 0x20c;
    }
  }
  r = *(size_t *)((long)_rs + lVar3);
  lVar3 = 4;
  do {
    if ((ushort)(seed->zi[lVar3 + -4] + 0x117) < 0x118) {
      return 0x20c;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x23);
  eVar2 = stb99DiVal(seed,r);
  if (eVar2 == 0) {
    eVar2 = stb99RiVal(seed,r);
    return eVar2;
  }
  return eVar2;
}

Assistant:

err_t stb99SeedVal(const stb99_seed* seed)
{
	err_t code;
	size_t i;
	size_t r;
	// проверить указатели
	if (!memIsValid(seed, sizeof(stb99_seed)))
		return ERR_BAD_INPUT;
	// проверить l
	for (i = 0; i < COUNT_OF(_ls); ++i)
		if (_ls[i] == seed->l)
			break;
	if (i == COUNT_OF(_ls))
		return ERR_BAD_SEED;
	// определить r = r(l)
	r = _rs[i];
	// проверить числа zi
	code = stb99ZiVal(seed);
	ERR_CALL_CHECK(code);
	// проверить цепочку di
	code = stb99DiVal(seed, r);
	ERR_CALL_CHECK(code);
	// проверить цепочку ri
	code = stb99RiVal(seed, r);
	ERR_CALL_CHECK(code);
	// все хорошо
	return ERR_OK;
}